

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_control_block.hpp
# Opt level: O2

bool Fossilize::shared_control_block_write
               (SharedControlBlock *control_block,void *data_,uint32_t size)

{
  uint in_EAX;
  uint uVar1;
  size_t __n;
  void *__dest;
  
  uVar1 = control_block->ring_buffer_size;
  if ((0x3f < uVar1) &&
     (in_EAX = control_block->read_count + uVar1, control_block->write_count + 0x40 <= in_EAX)) {
    __dest = (void *)((long)&control_block->version_cookie +
                     (ulong)control_block->ring_buffer_offset);
    uVar1 = uVar1 - control_block->write_offset;
    __n = 0x40;
    if (uVar1 < 0x40) {
      __n = (size_t)uVar1;
    }
    memcpy((void *)((ulong)control_block->write_offset + (long)__dest),data_,__n);
    if (uVar1 < 0x40) {
      memcpy(__dest,(void *)((long)data_ + __n),(ulong)(0x40 - (int)__n));
    }
    in_EAX = control_block->write_offset + 0x40;
    control_block->write_offset = control_block->ring_buffer_size - 1 & in_EAX;
    control_block->write_count = control_block->write_count + 0x40;
  }
  return SUB41(in_EAX,0);
}

Assistant:

static inline bool shared_control_block_write(SharedControlBlock *control_block,
                                              const void *data_, uint32_t size)
{
	auto *data = static_cast<const uint8_t *>(data_);
	uint8_t *ring = reinterpret_cast<uint8_t *>(control_block) + control_block->ring_buffer_offset;

	if (size > control_block->ring_buffer_size)
		return false;

	uint32_t max_capacity_write_count = control_block->read_count + control_block->ring_buffer_size;
	if (control_block->write_count + size > max_capacity_write_count)
		return false;

	uint32_t write_first = control_block->ring_buffer_size - control_block->write_offset;
	uint32_t write_second = 0;
	if (write_first > size)
		write_first = size;
	write_second = size - write_first;

	memcpy(ring + control_block->write_offset, data, write_first);
	if (write_second)
		memcpy(ring, data + write_first, write_second);

	control_block->write_offset = (control_block->write_offset + size) & (control_block->ring_buffer_size - 1);
	control_block->write_count += size;

	return true;
}